

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# live.cc
# Opt level: O3

csptr __thiscall pstack::Procman::LiveProcess::getAUXV(LiveProcess *this)

{
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  long in_RSI;
  csptr cVar1;
  _func_int **local_38;
  Addr AStack_30;
  undefined1 local_19;
  
  std::__shared_ptr<pstack::Procman::LiveReader,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<pstack::Procman::LiveReader>,pstack::Context&,int_const&,char_const(&)[5]>
            ((__shared_ptr<pstack::Procman::LiveReader,(__gnu_cxx::_Lock_policy)2> *)&local_38,
             (allocator<pstack::Procman::LiveReader> *)&local_19,*(Context **)(in_RSI + 0xa0),
             (int *)(in_RSI + 0xb8),(char (*) [5])0x13340f);
  (this->super_Process)._vptr_Process = local_38;
  (this->super_Process).entry = AStack_30;
  cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (csptr)cVar1.super___shared_ptr<const_pstack::Reader,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Reader::csptr LiveProcess::getAUXV() const {
    return std::make_shared<LiveReader>(context, pid, "auxv");
}